

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O1

void __thiscall
sglr::Context::texImage2D
          (Context *this,deUint32 target,int level,deUint32 internalFormat,Surface *src)

{
  uint width;
  uint height;
  void *data;
  TextureFormat local_60;
  ConstPixelBufferAccess local_58;
  
  width = src->m_width;
  height = src->m_height;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  data = (void *)(src->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (src->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,&local_60,width,height,1,data);
  (*this->_vptr_Context[0x11])
            (this,(ulong)target,(ulong)(uint)level,(ulong)internalFormat,(ulong)width,(ulong)height,
             0,0x1908,0x1401,local_58.m_data);
  return;
}

Assistant:

void Context::texImage2D (deUint32 target, int level, deUint32 internalFormat, const tcu::Surface& src)
{
	int		width	= src.getWidth();
	int		height	= src.getHeight();
	texImage2D(target, level, internalFormat, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, src.getAccess().getDataPtr());
}